

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>::dx
          (FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_> *this,int i
          )

{
  Fad<double> *pFVar1;
  double *pdVar2;
  double dVar3;
  
  pFVar1 = (this->right_->fadexpr_).right_;
  pdVar2 = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    pdVar2 = (pFVar1->dx_).ptr_to_data + i;
  }
  dVar3 = (double)(this->right_->fadexpr_).left_.constant_ + pFVar1->val_;
  return ((double)(this->left_).constant_ * -*pdVar2) / (dVar3 * dVar3);
}

Assistant:

const value_type dx(int i) const {return  (- right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}